

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.cpp
# Opt level: O2

int compare(string *directory1,string *basename1,string *directory2,string *basename2,
           Bounds *iBounds,Bounds *jBounds,Bounds *kBounds,Bounds *lBounds,double tolerance,
           bool infoOnly,
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *specificFields)

{
  string *__lhs;
  pointer pbVar1;
  pointer pbVar2;
  string *psVar3;
  bool bVar4;
  byte bVar5;
  ulong uVar6;
  ostream *poVar7;
  ulong uVar8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  DataFieldInfo *pDVar10;
  ulong uVar11;
  uint uVar12;
  ulong __new_size;
  string *fieldname;
  uint unaff_R14D;
  char cVar13;
  byte bVar14;
  vector<ser::Savepoint,_std::allocator<ser::Savepoint>_> savepoints;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fieldsAtSavepoint;
  vector<bool,_std::allocator<bool>_> failed;
  IJKLBounds bounds;
  Serializer serializer1;
  Serializer serializer2;
  DataFieldInfo info1;
  DataFieldInfo info2;
  
  serializer1.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &serializer1.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header;
  serializer1._vptr_Serializer = (_func_int **)&PTR__Serializer_00138bd8;
  serializer1.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  serializer1.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  serializer1.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  serializer1.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &serializer1.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header;
  serializer1.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  serializer1.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  serializer1.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &serializer1.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header;
  serializer1.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  serializer1.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  serializer1.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  serializer1.offsetTable_.savepoints_.
  super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  serializer1.offsetTable_.entries_.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  serializer1.offsetTable_.savepoints_.
  super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  serializer1.offsetTable_.savepoints_.
  super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  serializer1.offsetTable_.entries_.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  serializer1.offsetTable_.entries_.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  serializer1.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  serializer1.pFileFormat_.px = (element_type *)0x0;
  serializer1.pFileFormat_.pn.pi_ = (sp_counted_base *)0x0;
  serializer1.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       serializer1.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  serializer1.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       serializer1.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  serializer1.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       serializer1.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
  ;
  ser::Serializer::Init(&serializer1,directory1,basename1,SerializerOpenModeRead);
  serializer2.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &serializer2.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header;
  serializer2._vptr_Serializer = (_func_int **)&PTR__Serializer_00138bd8;
  serializer2.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  serializer2.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  serializer2.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  serializer2.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &serializer2.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header;
  serializer2.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  serializer2.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  serializer2.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &serializer2.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header;
  serializer2.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  serializer2.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  serializer2.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  serializer2.offsetTable_.savepoints_.
  super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  serializer2.offsetTable_.entries_.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  serializer2.offsetTable_.savepoints_.
  super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  serializer2.offsetTable_.savepoints_.
  super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  serializer2.offsetTable_.entries_.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  serializer2.offsetTable_.entries_.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  serializer2.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  serializer2.pFileFormat_.px = (element_type *)0x0;
  serializer2.pFileFormat_.pn.pi_ = (sp_counted_base *)0x0;
  serializer2.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       serializer2.globalMetainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  serializer2.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       serializer2.fieldsTable_.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  serializer2.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       serializer2.offsetTable_.savepointIndex_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
  ;
  ser::Serializer::Init(&serializer2,directory2,basename2,SerializerOpenModeRead);
  std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::vector
            (&savepoints,&serializer1.offsetTable_.savepoints_);
  uVar11 = 0;
  bVar5 = 0;
  do {
    uVar6 = ((long)savepoints.super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)savepoints.super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                  _M_impl.super__Vector_impl_data._M_start) / 0x50;
    if (uVar6 <= uVar11) {
LAB_00119973:
      uVar12 = (uint)bVar5;
      if (uVar11 < uVar6) {
        uVar12 = unaff_R14D;
      }
      std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::~vector(&savepoints);
      ser::Serializer::~Serializer(&serializer2);
      ser::Serializer::~Serializer(&serializer1);
      return uVar12;
    }
    std::__cxx11::string::substr
              ((ulong)&info1,
               (ulong)(savepoints.
                       super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar11));
    bVar4 = std::operator!=(&info1.name_,"-out");
    std::__cxx11::string::~string((string *)&info1);
    if (!bVar4) {
      poVar7 = std::operator<<((ostream *)&std::cout,"---------------------------------");
      std::endl<char,std::char_traits<char>>(poVar7);
      poVar7 = std::operator<<((ostream *)&std::cout,
                               (string *)
                               (savepoints.
                                super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                                _M_impl.super__Vector_impl_data._M_start + uVar11));
      std::endl<char,std::char_traits<char>>(poVar7);
      ser::MetainfoSet::ToString_abi_cxx11_
                (&info1.name_,
                 &savepoints.super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar11].metainfo_);
      poVar7 = std::operator<<((ostream *)&std::cout,(string *)&info1);
      std::endl<char,std::char_traits<char>>(poVar7);
      std::__cxx11::string::~string((string *)&info1);
      ser::Serializer::FieldsAtSavepoint_abi_cxx11_
                (&fieldsAtSavepoint,&serializer1,
                 savepoints.super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar11);
      fields.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      fields.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      fields.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pbVar1 = (specificFields->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (specificFields->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar1 == pbVar2) {
        ser::Serializer::FieldsAtSavepoint_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&info1,&serializer1,
                   savepoints.super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar11);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(&fields,&info1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&info1);
        fieldname = fields.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        psVar3 = fields.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        uVar8 = (long)pbVar2 - (long)pbVar1 >> 5;
        __new_size = (long)fieldsAtSavepoint.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)fieldsAtSavepoint.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5;
        if (uVar8 <= __new_size) {
          __new_size = uVar8;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize(&fields,__new_size);
        _Var9 = std::
                __set_intersection<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (fieldsAtSavepoint.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           fieldsAtSavepoint.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (specificFields->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,
                           (specificFields->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish,
                           fields.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize(&fields,(long)_Var9._M_current -
                         (long)fields.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5);
        fieldname = fields.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        psVar3 = fields.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      for (; fieldname != psVar3; fieldname = fieldname + 1) {
        poVar7 = std::operator<<((ostream *)&std::cout,'\t');
        poVar7 = std::operator<<(poVar7,(string *)fieldname);
        std::endl<char,std::char_traits<char>>(poVar7);
        pDVar10 = ser::Serializer::FindField(&serializer1,fieldname);
        ser::DataFieldInfo::DataFieldInfo(&info1,pDVar10);
        pDVar10 = ser::Serializer::FindField(&serializer2,fieldname);
        ser::DataFieldInfo::DataFieldInfo(&info2,pDVar10);
        getIJKLBounds(&bounds,&info1,iBounds,jBounds,kBounds,lBounds);
        bVar4 = compareInfo(&info1,&info2);
        uVar12 = 1;
        if (bVar4) {
          uVar12 = unaff_R14D;
        }
        if (bVar4 && !infoOnly) {
          failed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          failed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_offset = 0;
          failed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          failed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset = 0;
          failed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage = (_Bit_pointer)0x0;
          __lhs = &info1.type_;
          bVar4 = std::operator==(__lhs,"integer");
          if ((bVar4) || (bVar4 = std::operator==(__lhs,"int"), bVar4)) {
            bVar4 = compareData<int>(&serializer1,&serializer2,
                                     savepoints.
                                     super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar11,&info1,
                                     &info2,&bounds,tolerance,&failed);
            if (bVar4) {
LAB_0011974c:
              bVar14 = 0;
            }
            else {
              bVar14 = 1;
              printDifference<int>
                        (&serializer1,&serializer2,
                         savepoints.
                         super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl
                         .super__Vector_impl_data._M_start + uVar11,&info1,&info2,&bounds,&failed);
            }
LAB_0011978a:
            bVar5 = bVar5 | bVar14;
            cVar13 = '\0';
          }
          else {
            bVar4 = std::operator==(__lhs,"double");
            if (bVar4) {
              bVar4 = compareData<double>(&serializer1,&serializer2,
                                          savepoints.
                                          super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar11,&info1,
                                          &info2,&bounds,tolerance,&failed);
              if (bVar4) goto LAB_0011974c;
              bVar14 = 1;
              printDifference<double>
                        (&serializer1,&serializer2,
                         savepoints.
                         super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl
                         .super__Vector_impl_data._M_start + uVar11,&info1,&info2,&bounds,&failed);
              goto LAB_0011978a;
            }
            bVar4 = std::operator==(__lhs,"float");
            if (bVar4) {
              bVar4 = compareData<float>(&serializer1,&serializer2,
                                         savepoints.
                                         super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>
                                         ._M_impl.super__Vector_impl_data._M_start + uVar11,&info1,
                                         &info2,&bounds,tolerance,&failed);
              if (bVar4) goto LAB_0011974c;
              bVar14 = 1;
              printDifference<float>
                        (&serializer1,&serializer2,
                         savepoints.
                         super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl
                         .super__Vector_impl_data._M_start + uVar11,&info1,&info2,&bounds,&failed);
              goto LAB_0011978a;
            }
            poVar7 = std::operator<<((ostream *)&std::cerr,"Unsupported type: ");
            poVar7 = std::operator<<(poVar7,(string *)&info1.type_);
            std::endl<char,std::char_traits<char>>(poVar7);
            cVar13 = '\x01';
            unaff_R14D = 2;
          }
          std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                    (&failed.super__Bvector_base<std::allocator<bool>_>);
        }
        else {
          cVar13 = bVar4 * '\x05' + '\x01';
          unaff_R14D = uVar12;
        }
        ser::DataFieldInfo::~DataFieldInfo(&info2);
        ser::DataFieldInfo::~DataFieldInfo(&info1);
        if ((cVar13 != '\x06') && (cVar13 != '\0')) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&fields);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&fieldsAtSavepoint);
          goto LAB_00119973;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&fields);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&fieldsAtSavepoint);
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

int compare(const std::string& directory1, const std::string& basename1,
            const std::string& directory2, const std::string& basename2,
            const Bounds& iBounds, const Bounds& jBounds,
            const Bounds& kBounds, const Bounds& lBounds,
            double tolerance, bool infoOnly, const vector<string>& specificFields)

{
    Serializer serializer1;
    serializer1.Init(directory1, basename1, SerializerOpenModeRead);

    Serializer serializer2;
    serializer2.Init(directory2, basename2, SerializerOpenModeRead);

    vector<Savepoint> savepoints = serializer1.savepoints();

    bool hasDifferences = false;

    for (int i = 0; i < savepoints.size(); i++)
    {
        if (savepoints[i].name().substr(savepoints[i].name().size() - 4, 4) != "-out")
            continue;

        std::cout << "---------------------------------" << std::endl;
        std::cout << savepoints[i].name()                << std::endl;
        std::cout << savepoints[i].metainfo().ToString() << std::endl;

        vector<string> fieldsAtSavepoint = serializer1.FieldsAtSavepoint(savepoints[i]);
        vector<string> fields;

        if (specificFields.empty()) {

            fields = serializer1.FieldsAtSavepoint(savepoints[i]);
        } else {
            fields.resize(std::min(specificFields.size(), fieldsAtSavepoint.size()));
            auto it = std::set_intersection(fieldsAtSavepoint.begin(), fieldsAtSavepoint.end(),
                specificFields.begin(), specificFields.end(), fields.begin());
            fields.resize(it - fields.begin());
        }

        for (auto const& field : fields) {
            std::cout << '\t' << field << std::endl;

            DataFieldInfo info1 = serializer1.FindField(field);
            DataFieldInfo info2 = serializer2.FindField(field);

            IJKLBounds bounds = getIJKLBounds(info1, iBounds, jBounds, kBounds, lBounds);

            bool equal = compareInfo(info1, info2);
            if (!equal) {
                return 1;
            } else if (infoOnly) {
                continue;
            }

            vector<bool> failed;

            if (info1.type() == "integer" || info1.type() == "int") {
                equal = compareData<int>(serializer1, serializer2, savepoints[i], info1, info2, bounds, tolerance, failed);
                if (!equal) {
                    printDifference<int>(serializer1, serializer2, savepoints[i], info1, info2, bounds, failed);
                }
            } else if (info1.type() == "double") {
                equal = compareData<double>(serializer1, serializer2, savepoints[i], info1, info2, bounds, tolerance, failed);
                if (!equal) {
                    printDifference<double>(serializer1, serializer2, savepoints[i], info1, info2, bounds, failed);
                }
            } else if (info1.type() == "float") {
                equal = compareData<float>(serializer1, serializer2, savepoints[i], info1, info2, bounds, tolerance, failed);
                if (!equal) {
                    printDifference<float>(serializer1, serializer2, savepoints[i], info1, info2, bounds, failed);
                }
            } else {
                std::cerr << "Unsupported type: " << info1.type() << std::endl;
                return 2;
            }
            hasDifferences = hasDifferences | !equal;
        }
    }

    if (hasDifferences) {
        return 1;
    }
    return 0;
}